

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddEvaluationFile
          (cmMakefile *this,string *inputFile,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *outputName,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *condition,bool inputIsContent)

{
  pointer pcVar1;
  PolicyStatus policyStatusCMP0070;
  cmGeneratorExpressionEvaluationFile *this_00;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_68;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_60;
  string local_58;
  cmGeneratorExpressionEvaluationFile *local_38;
  
  this_00 = (cmGeneratorExpressionEvaluationFile *)operator_new(0x50);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar1 = (inputFile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + inputFile->_M_string_length);
  local_60._M_head_impl =
       (outputName->_M_t).
       super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
       .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
  (outputName->_M_t).
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (cmCompiledGeneratorExpression *)0x0;
  local_68._M_head_impl =
       (condition->_M_t).
       super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
       .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
  (condition->_M_t).
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (cmCompiledGeneratorExpression *)0x0;
  policyStatusCMP0070 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0070,false);
  cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
            (this_00,&local_58,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)&local_60,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)&local_68,inputIsContent,policyStatusCMP0070);
  local_38 = this_00;
  std::
  vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>
  ::emplace_back<cmGeneratorExpressionEvaluationFile*>
            ((vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>
              *)&this->EvaluationFiles,&local_38);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_68);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::AddEvaluationFile(
  const std::string& inputFile,
  std::unique_ptr<cmCompiledGeneratorExpression> outputName,
  std::unique_ptr<cmCompiledGeneratorExpression> condition,
  bool inputIsContent)
{
  this->EvaluationFiles.push_back(new cmGeneratorExpressionEvaluationFile(
    inputFile, std::move(outputName), std::move(condition), inputIsContent,
    this->GetPolicyStatus(cmPolicies::CMP0070)));
}